

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableTest_SimpleDataTypeOptimizations_Test::TestBody
          (HashtableTest_SimpleDataTypeOptimizations_Test *this)

{
  bool bVar1;
  AssertHelper *this_00;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  int memmove_nonstandard_alloc_copies;
  int i_2;
  int nomemmove_copies;
  int i_1;
  int memmove_copies;
  int i;
  sparse_hash_map<int,_Memmove,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  memmove_nonstandard_alloc;
  sparse_hash_map<int,_NoMemmove,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_NoMemmove>_>_>
  nomemmove;
  sparse_hash_map<int,_Memmove,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_Memmove>_>_>
  memmove;
  key_type *in_stack_fffffffffffffd48;
  allocator_type *in_stack_fffffffffffffd50;
  undefined7 in_stack_fffffffffffffd58;
  undefined1 in_stack_fffffffffffffd5f;
  hasher *in_stack_fffffffffffffd60;
  undefined4 in_stack_fffffffffffffd68;
  undefined4 in_stack_fffffffffffffd6c;
  int line;
  sparse_hash_map<int,_Memmove,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_fffffffffffffd70;
  data_type *in_stack_fffffffffffffd78;
  Type type;
  AssertHelper *in_stack_fffffffffffffd80;
  AssertionResult local_248;
  Message *in_stack_fffffffffffffdc8;
  AssertHelper *in_stack_fffffffffffffdd0;
  AssertionResult local_228;
  int local_214;
  Memmove local_210;
  int local_20c;
  int local_208;
  NoMemmove local_204;
  int local_200;
  int local_1fc;
  Memmove local_1f8;
  int local_1f4;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_1f0;
  Hasher local_1e0;
  Hasher local_1d4 [13];
  libc_allocator_with_realloc<std::pair<const_int,_NoMemmove>_> local_131;
  Hasher local_130;
  Hasher local_124 [12];
  libc_allocator_with_realloc<std::pair<const_int,_Memmove>_> local_91;
  Hasher local_90;
  Hasher local_84 [11];
  
  Hasher::Hasher(local_84,0);
  Hasher::Hasher(&local_90,0);
  google::libc_allocator_with_realloc<std::pair<const_int,_Memmove>_>::libc_allocator_with_realloc
            (&local_91);
  google::
  sparse_hash_map<int,_Memmove,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_Memmove>_>_>
  ::sparse_hash_map((sparse_hash_map<int,_Memmove,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_Memmove>_>_>
                     *)in_stack_fffffffffffffd70,
                    CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
                    in_stack_fffffffffffffd60,
                    (key_equal *)CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58),
                    (allocator_type *)in_stack_fffffffffffffd50);
  google::libc_allocator_with_realloc<std::pair<const_int,_Memmove>_>::~libc_allocator_with_realloc
            (&local_91);
  Hasher::Hasher(local_124,0);
  Hasher::Hasher(&local_130,0);
  google::libc_allocator_with_realloc<std::pair<const_int,_NoMemmove>_>::libc_allocator_with_realloc
            (&local_131);
  google::
  sparse_hash_map<int,_NoMemmove,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_NoMemmove>_>_>
  ::sparse_hash_map((sparse_hash_map<int,_NoMemmove,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_NoMemmove>_>_>
                     *)in_stack_fffffffffffffd70,
                    CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
                    in_stack_fffffffffffffd60,
                    (key_equal *)CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58),
                    (allocator_type *)in_stack_fffffffffffffd50);
  google::libc_allocator_with_realloc<std::pair<const_int,_NoMemmove>_>::
  ~libc_allocator_with_realloc(&local_131);
  Hasher::Hasher(local_1d4,0);
  Hasher::Hasher(&local_1e0,0);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(&local_1f0,0,(int *)0x0);
  google::
  sparse_hash_map<int,_Memmove,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::sparse_hash_map(in_stack_fffffffffffffd70,
                    CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
                    in_stack_fffffffffffffd60,
                    (key_equal *)CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58),
                    in_stack_fffffffffffffd50);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_1f0);
  Memmove::num_copies = 0;
  for (local_1f4 = 10000; 0 < local_1f4; local_1f4 = local_1f4 + -1) {
    Memmove::Memmove(&local_1f8,local_1f4);
    in_stack_fffffffffffffd80 =
         (AssertHelper *)
         google::
         sparse_hash_map<int,_Memmove,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_Memmove>_>_>
         ::operator[]((sparse_hash_map<int,_Memmove,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_Memmove>_>_>
                       *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
    *(int *)&(((unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&in_stack_fffffffffffffd80->data_)->_M_t).
             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl = local_1f8.i;
  }
  local_1fc = Memmove::num_copies;
  NoMemmove::num_copies = 0;
  for (local_200 = 10000; 0 < local_200; local_200 = local_200 + -1) {
    NoMemmove::NoMemmove(&local_204,local_200);
    in_stack_fffffffffffffd78 =
         google::
         sparse_hash_map<int,_NoMemmove,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_NoMemmove>_>_>
         ::operator[]((sparse_hash_map<int,_NoMemmove,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_NoMemmove>_>_>
                       *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
    in_stack_fffffffffffffd78->i = local_204.i;
  }
  local_208 = NoMemmove::num_copies;
  Memmove::num_copies = 0;
  for (local_20c = 10000; type = (Type)((ulong)in_stack_fffffffffffffd78 >> 0x20), 0 < local_20c;
      local_20c = local_20c + -1) {
    Memmove::Memmove(&local_210,local_20c);
    in_stack_fffffffffffffd70 =
         (sparse_hash_map<int,_Memmove,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          *)google::
            sparse_hash_map<int,_Memmove,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
            ::operator[]((sparse_hash_map<int,_Memmove,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                          *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
    (in_stack_fffffffffffffd70->rep).settings.
    super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.super_Hasher.id_ = local_210.i;
  }
  local_214 = Memmove::num_copies;
  testing::internal::CmpHelperGT<int,int>
            ((char *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
             (char *)in_stack_fffffffffffffd60,
             (int *)CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58),
             &in_stack_fffffffffffffd50->id_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_228);
  line = CONCAT13(bVar1,(int3)in_stack_fffffffffffffd6c);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffd80);
    in_stack_fffffffffffffd60 =
         (hasher *)testing::AssertionResult::failure_message((AssertionResult *)0x9e9a18);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffd80,type,(char *)in_stack_fffffffffffffd70,line,
               (char *)in_stack_fffffffffffffd60);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffd50);
    testing::Message::~Message((Message *)0x9e9a75);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x9e9aca);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT44(line,in_stack_fffffffffffffd68),(char *)in_stack_fffffffffffffd60,
             (int *)CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58),
             &in_stack_fffffffffffffd50->id_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_248);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffd80);
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x9e9b54)
    ;
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffd80,type,(char *)in_stack_fffffffffffffd70,line,
               (char *)in_stack_fffffffffffffd60);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x9e9ba2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x9e9bee);
  google::
  sparse_hash_map<int,_Memmove,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~sparse_hash_map((sparse_hash_map<int,_Memmove,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                      *)0x9e9bfb);
  google::
  sparse_hash_map<int,_NoMemmove,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_NoMemmove>_>_>
  ::~sparse_hash_map((sparse_hash_map<int,_NoMemmove,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_NoMemmove>_>_>
                      *)0x9e9c08);
  google::
  sparse_hash_map<int,_Memmove,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_Memmove>_>_>
  ::~sparse_hash_map((sparse_hash_map<int,_Memmove,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_Memmove>_>_>
                      *)0x9e9c15);
  return;
}

Assistant:

TEST(HashtableTest, SimpleDataTypeOptimizations) {
  // Only sparsehashtable optimizes moves in this way.
  sparse_hash_map<int, Memmove, Hasher, Hasher> memmove;
  sparse_hash_map<int, NoMemmove, Hasher, Hasher> nomemmove;
  sparse_hash_map<int, Memmove, Hasher, Hasher, Alloc<int>>
      memmove_nonstandard_alloc;

  Memmove::num_copies = 0;
  for (int i = 10000; i > 0; i--) {
    memmove[i] = Memmove(i);
  }
  const int memmove_copies = Memmove::num_copies;

  NoMemmove::num_copies = 0;
  for (int i = 10000; i > 0; i--) {
    nomemmove[i] = NoMemmove(i);
  }
  const int nomemmove_copies = NoMemmove::num_copies;

  Memmove::num_copies = 0;
  for (int i = 10000; i > 0; i--) {
    memmove_nonstandard_alloc[i] = Memmove(i);
  }
  const int memmove_nonstandard_alloc_copies = Memmove::num_copies;

  EXPECT_GT(nomemmove_copies, memmove_copies);
  EXPECT_EQ(nomemmove_copies, memmove_nonstandard_alloc_copies);
}